

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O2

void __thiscall vkt::anon_unknown_0::TaskExecutor::~TaskExecutor(TaskExecutor *this)

{
  Task *in_RAX;
  pointer pSVar1;
  pointer pSVar2;
  size_t ndx;
  ulong uVar3;
  long lVar4;
  Task *local_28;
  
  uVar3 = 0;
  local_28 = in_RAX;
  while( true ) {
    pSVar1 = (this->m_threads).
             super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (this->m_threads).
             super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pSVar2 - (long)pSVar1 >> 4) <= uVar3) break;
    local_28 = (Task *)0x0;
    de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::pushFront
              (&this->m_tasks,&local_28);
    uVar3 = uVar3 + 1;
  }
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < (ulong)((long)pSVar2 - (long)pSVar1 >> 4); uVar3 = uVar3 + 1) {
    de::Thread::join(*(Thread **)((long)&pSVar1->m_ptr + lVar4));
    pSVar1 = (this->m_threads).
             super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (this->m_threads).
             super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = lVar4 + 0x10;
  }
  de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::~ThreadSafeRingBuffer
            (&this->m_tasks);
  std::
  vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
  ::~vector(&this->m_threads);
  return;
}

Assistant:

TaskExecutor::~TaskExecutor (void)
{
	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_tasks.pushFront(DE_NULL);

	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_threads[ndx]->join();
}